

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O2

void __thiscall
utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
Initialize(NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int> *this
          ,char **src,size_t srcCount)

{
  if (srcCount == 0xffffffffffffffff) {
    srcCount = NarrowWideStringConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
               ::Length(*src);
  }
  NarrowStringToWide<utf8::malloc_allocator>
            (*src,srcCount,&this->dst,&this->dstCount,&this->allocateCount);
  this->freeDst = true;
  return;
}

Assistant:

void Initialize(const SrcType& src, size_t srcCount = -1)
        {
            if (srcCount == -1)
            {
                srcCount = StringConverter::Length(src);
            }

            StringConverter::Convert(src, srcCount, &dst, &dstCount, &allocateCount);
            freeDst = true;
        }